

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

string * __thiscall
cmExportInstallFileGenerator::GetCxxModulesDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmExportInstallFileGenerator *this)

{
  cmExportInstallFileGenerator *this_local;
  
  cmInstallExportGenerator::GetCxxModuleDirectory_abi_cxx11_(__return_storage_ptr__,this->IEGen);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportInstallFileGenerator::GetCxxModulesDirectory() const
{
  return IEGen->GetCxxModuleDirectory();
}